

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O1

double ApproxDist2Ortho(ON_Xform *L)

{
  double dVar1;
  double *pdVar2;
  ON_Interval OVar3;
  ON_Interval Spec;
  ON_Interval local_18;
  
  OVar3 = ApproxSpectrumLTL(L);
  local_18.m_t[1] = OVar3.m_t[1];
  local_18.m_t[0] = OVar3.m_t[0];
  pdVar2 = ON_Interval::operator[](&local_18,0);
  if (*pdVar2 <= 0.0 && *pdVar2 != 0.0) {
    pdVar2 = ON_Interval::operator[](&local_18,0);
    *pdVar2 = 0.0;
  }
  pdVar2 = ON_Interval::operator[](&local_18,0);
  dVar1 = *pdVar2;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  pdVar2 = ON_Interval::operator[](&local_18,0);
  *pdVar2 = dVar1 + -1.0;
  pdVar2 = ON_Interval::operator[](&local_18,1);
  dVar1 = *pdVar2;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  pdVar2 = ON_Interval::operator[](&local_18,1);
  *pdVar2 = dVar1 + -1.0;
  pdVar2 = ON_Interval::operator[](&local_18,0);
  dVar1 = ABS(*pdVar2);
  pdVar2 = ON_Interval::operator[](&local_18,1);
  if (dVar1 < ABS(*pdVar2)) {
    pdVar2 = ON_Interval::operator[](&local_18,1);
    dVar1 = ABS(*pdVar2);
  }
  return dVar1;
}

Assistant:

static double ApproxDist2Ortho(const ON_Xform& L)
{
	// L.IsLinear() is a precondition

	ON_Interval Spec = ApproxSpectrumLTL(L);
	if (Spec[0] < 0) Spec[0] = 0.0;
	Spec[0] = sqrt(Spec[0]) - 1.0;
	Spec[1] = sqrt(Spec[1]) - 1.0;		// contains Spectrum of (L^T L)^(-1/2) - I
	double dist = fabs(Spec[0]);
	if (dist < fabs(Spec[1]))
		dist = fabs(Spec[1]);

	return dist;
}